

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtzobj.cpp
# Opt level: O3

char * __thiscall
CVmObjTimeZone::cast_to_string(CVmObjTimeZone *this,vm_obj_id_t self,vm_val_t *newstr)

{
  vm_obj_id_t vVar1;
  size_t in_RAX;
  char *pcVar2;
  size_t len;
  size_t local_18;
  
  local_18 = in_RAX;
  pcVar2 = CVmTimeZone::get_name(*(CVmTimeZone **)(this->super_CVmObject).ext_,&local_18);
  vVar1 = CVmObjString::create(0,pcVar2,local_18);
  newstr->typ = VM_OBJ;
  (newstr->val).obj = vVar1;
  pcVar2 = vm_val_t::get_as_string(newstr);
  return pcVar2;
}

Assistant:

const char *CVmObjTimeZone::cast_to_string(
    VMG_ vm_obj_id_t self, vm_val_t *newstr) const
{
    /* get the time zone name */
    size_t len;
    const char *name = get_tz()->get_name(len);

    /* create the return string */
    newstr->set_obj(CVmObjString::create(vmg_ FALSE, name, len));
    return newstr->get_as_string(vmg0_);
}